

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e-hierarchy-trainer.cc
# Opt level: O2

void ReadSentencePair(string *line,vector<int,_std::allocator<int>_> *s,Dict *sd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *c,Dict *cd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *l,Dict *ld,int *unk,int *total)

{
  pointer pvVar1;
  __type _Var2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int local_25c;
  vector<int,_std::allocator<int>_> *local_258;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_250;
  long local_248;
  string word;
  int k;
  undefined4 uStack_204;
  char local_1f8 [16];
  vector<int,_std::allocator<int>_> ctmp;
  string sep;
  istringstream in;
  byte abStack_190 [352];
  
  local_258 = s;
  local_250 = l;
  std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)line,_S_in);
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&sep,"|||",(allocator *)&k);
  lVar6 = 0;
  local_248 = lVar6;
  lVar5 = lVar6;
  do {
    while( true ) {
      while( true ) {
        if (((abStack_190[*(long *)(_in + -0x18)] & 5) != 0) ||
           (std::operator>>((istream *)&in,(string *)&word),
           (abStack_190[*(long *)(_in + -0x18)] & 5) != 0)) {
          std::__cxx11::string::~string((string *)&sep);
          std::__cxx11::string::~string((string *)&word);
          std::__cxx11::istringstream::~istringstream((istringstream *)&in);
          return;
        }
        _Var2 = std::operator==(&word,&sep);
        if (!_Var2) break;
        lVar6 = lVar6 + 1;
        local_248 = lVar6;
        lVar5 = lVar6;
      }
      if ((int)lVar6 != 1) break;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize(local_250,
               (long)(local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(local_258->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2);
LAB_001d8180:
      pvVar1 = (local_250->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar3 = cnn::Dict::Convert(ld,&word);
      k = iVar3;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar1 + lVar5 + -1,&k);
      lVar6 = local_248;
    }
    if ((int)lVar6 != 0) goto LAB_001d8180;
    *total = *total + 1;
    ctmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ctmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    ctmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    for (uVar4 = 0; uVar4 < word._M_string_length; uVar4 = uVar4 + 1) {
      _k = local_1f8;
      std::__cxx11::string::_M_construct((ulong)&k,'\x01');
      local_25c = cnn::Dict::Convert(cd,(string *)&k);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)
                 &ctmp.super__Vector_base<int,_std::allocator<int>_>,&local_25c);
      std::__cxx11::string::~string((string *)&k);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(c,(value_type *)&ctmp.super__Vector_base<int,_std::allocator<int>_>);
    normalize_digital_lower(&word);
    iVar3 = cnn::Dict::Convert(sd,&word);
    lVar6 = local_248;
    k = iVar3;
    if (iVar3 == kUNK) {
      *unk = *unk + 1;
    }
    std::vector<int,_std::allocator<int>_>::push_back(local_258,(value_type_conflict1 *)&k);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&ctmp.super__Vector_base<int,_std::allocator<int>_>);
  } while( true );
}

Assistant:

void ReadSentencePair(const string& line, vector<int>* s, cnn::Dict* sd, vector< vector<int> >* c, cnn::Dict* cd, vector< vector<int> >& l, cnn::Dict* ld, int& unk, int& total){
  istringstream in(line);
  string word;
  string sep = "|||";
  int f = 0;

  while(in) {
    in >> word;
    if (!in) break;

    if (word == sep) { f+=1; continue; }
    
    if(f == 0) {
      total += 1;
      vector<int> ctmp;
      for(unsigned i = 0; i < word.size(); i ++){
        ctmp.push_back(cd->Convert(string(1,word[i])));
      }
      c->push_back(ctmp);
      normalize_digital_lower(word);
      int k = sd->Convert(word);
      if(k == kUNK) unk++;
      s->push_back(k);
    }
    else {
      if(f == 1) l.resize(s->size());
      l[f-1].push_back(ld->Convert(word));
    }
  }
}